

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,true,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uhugeint_t uVar10;
  uhugeint_t uVar11;
  uhugeint_t right;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar10 = *ldata;
      lVar5 = 8;
      iVar6 = 0;
      do {
        uVar11.upper = *(uint64_t *)((long)&rdata->lower + lVar5);
        uVar11.lower = *(uint64_t *)((long)rdata + lVar5 + -8);
        uVar11 = BinaryZeroIsNullWrapper::
                 Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                           (fun,uVar10,uVar11,mask,iVar6);
        *(uint64_t *)((long)result_data + lVar5 + -8) = uVar11.lower;
        *(uint64_t *)((long)&result_data->lower + lVar5) = uVar11.upper;
        iVar6 = iVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    iVar6 = 0;
    uVar3 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = iVar6 + 0x40;
        if (count <= iVar6 + 0x40) {
          uVar9 = count;
        }
LAB_009c192a:
        uVar2 = iVar6;
        if (iVar6 < uVar9) {
          uVar10 = *ldata;
          uVar4 = iVar6 << 4 | 8;
          do {
            right.upper = *(uint64_t *)((long)&rdata->lower + uVar4);
            right.lower = *(uint64_t *)((long)rdata + (uVar4 - 8));
            uVar11 = BinaryZeroIsNullWrapper::
                     Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                               (fun,uVar10,right,mask,iVar6);
            *(uint64_t *)((long)result_data + (uVar4 - 8)) = uVar11.lower;
            *(uint64_t *)((long)&result_data->lower + uVar4) = uVar11.upper;
            iVar6 = iVar6 + 1;
            uVar4 = uVar4 + 0x10;
            uVar2 = uVar9;
          } while (uVar9 != iVar6);
        }
      }
      else {
        uVar4 = puVar1[uVar3];
        uVar9 = iVar6 + 0x40;
        if (count <= iVar6 + 0x40) {
          uVar9 = count;
        }
        uVar2 = uVar9;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_009c192a;
          uVar2 = iVar6;
          if (iVar6 < uVar9) {
            uVar7 = iVar6 << 4 | 8;
            uVar8 = 0;
            do {
              if ((uVar4 >> (uVar8 & 0x3f) & 1) != 0) {
                uVar10.upper = *(uint64_t *)((long)&rdata->lower + uVar7);
                uVar10.lower = *(uint64_t *)((long)rdata + (uVar7 - 8));
                uVar10 = BinaryZeroIsNullWrapper::
                         Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                                   (fun,*ldata,uVar10,mask,uVar8 + iVar6);
                *(uint64_t *)((long)result_data + (uVar7 - 8)) = uVar10.lower;
                *(uint64_t *)((long)&result_data->lower + uVar7) = uVar10.upper;
              }
              uVar8 = uVar8 + 1;
              uVar7 = uVar7 + 0x10;
              uVar2 = uVar9;
            } while (uVar9 - iVar6 != uVar8);
          }
        }
      }
      iVar6 = uVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}